

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knowledge_dynamics.cc
# Opt level: O3

void __thiscall explode::knowledge_dynamics::unpack(knowledge_dynamics *this,output_exe_file *oexe)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint16_t *puVar4;
  decoder_error *this_00;
  ushort uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint16_t dict_key [12288];
  uint8_t dict_val [12288];
  char mbuffer [1024];
  uint8_t queue [255];
  ulong local_50;
  ulong local_48;
  int local_34;
  
  (*this->m_file->_vptr_input[5])(this->m_file,(ulong)this->m_code_offs);
  iVar3 = (*this->m_file->_vptr_input[2])(this->m_file,dict_val + 0x2ff8,0x400);
  uVar5 = 0x102;
  local_34 = CONCAT22((short)((uint)iVar3 >> 0x10),0x200);
  local_50 = 0;
  local_48 = 0;
  uVar9 = 9;
  uVar14 = 0;
  lVar8 = 0;
LAB_0010968b:
  do {
    bVar15 = false;
    do {
      uVar7 = uVar9;
      if (bVar15) {
        uVar7 = 9;
      }
      uVar11 = uVar14 >> 3;
      uVar13 = (ulong)((uint)uVar14 & 7);
      uVar12 = uVar13;
      if (0x1fe7 < uVar14) {
        if (uVar11 - 0x400 != 0) {
          lVar6 = -0x400;
          do {
            mbuffer[lVar6 + 0x3f8] = mbuffer[lVar6 + uVar11 + 0x3f8];
            lVar6 = lVar6 + 1;
          } while (uVar11 + lVar6 != 0);
        }
        uVar12 = -(uVar11 - 0x400);
        iVar3 = (*this->m_file->_vptr_input[4])();
        if (CONCAT44(extraout_var,iVar3) < uVar11) {
          uVar11 = CONCAT44(extraout_var,iVar3);
        }
        (*this->m_file->_vptr_input[2])(this->m_file,dict_val + uVar12 + 0x2ff8,uVar11);
        if (!bVar15) {
          uVar12 = uVar13;
        }
        uVar11 = 0;
        uVar14 = uVar13;
      }
      if (7 < uVar7 - 9) {
        this_00 = (decoder_error *)__cxa_allocate_exception(0x10);
        decoder_error::decoder_error(this_00,"Overflow");
        goto LAB_00109a1d;
      }
      uVar14 = uVar14 + uVar7;
      uVar10 = (uint)*(ushort *)("unsupported version" + uVar7 * 2 + 0x12) &
               ((uint)dict_val[uVar11 + 0x2ff8] |
               (uint)dict_val[uVar11 + 0x2ff9] << 8 | (uint)dict_val[uVar11 + 0x2ffa] << 0x10) >>
               ((byte)uVar12 & 0x1f);
      if (bVar15) {
        iVar3 = (*oexe->_vptr_output_exe_file[4])(oexe,lVar8,(ulong)(uVar10 & 0xff));
        local_34 = (int)CONCAT62((uint6)(ushort)((uint)iVar3 >> 0x10),0x200);
        local_50 = (ulong)uVar10;
        local_48 = (ulong)uVar10;
        uVar5 = 0x102;
        uVar9 = 9;
        lVar8 = lVar8 + 1;
        goto LAB_0010968b;
      }
      bVar15 = true;
    } while (uVar10 == 0x100);
    if (uVar10 == 0x101) {
      uVar1 = this->m_header[0xb];
      puVar4 = output_exe_file::operator[](oexe,INITIAL_CS);
      *puVar4 = uVar1;
      uVar1 = this->m_header[10];
      puVar4 = output_exe_file::operator[](oexe,INITIAL_IP);
      *puVar4 = uVar1;
      uVar1 = this->m_header[7];
      puVar4 = output_exe_file::operator[](oexe,INITIAL_SS);
      *puVar4 = uVar1;
      uVar1 = this->m_header[8];
      puVar4 = output_exe_file::operator[](oexe,INITIAL_SP);
      *puVar4 = uVar1;
      uVar1 = this->m_header[6];
      puVar4 = output_exe_file::operator[](oexe,MAX_MEM_PARA);
      *puVar4 = uVar1;
      uVar2 = this->m_expected_size;
      puVar4 = output_exe_file::operator[](oexe,MIN_MEM_PARA);
      *puVar4 = (uint16_t)(uVar2 + 0x20 >> 6);
      (*oexe->_vptr_output_exe_file[6])(oexe);
      return;
    }
    bVar15 = uVar5 <= (ushort)uVar10;
    if (bVar15) {
      mbuffer[0x3f8] = (char)local_50;
      local_50 = local_48;
    }
    else {
      local_50 = (ulong)uVar10;
    }
    uVar9 = (ulong)bVar15;
    if (0xff < (uint)local_50) {
      do {
        uVar11 = uVar9;
        if (uVar11 == 0xff) {
          this_00 = (decoder_error *)__cxa_allocate_exception(0x10);
          decoder_error::decoder_error(this_00,"Overflow");
          goto LAB_00109a1d;
        }
        if (0x2fff < (uint)local_50) {
          this_00 = (decoder_error *)__cxa_allocate_exception(0x10);
          decoder_error::decoder_error(this_00,"Overflow");
          goto LAB_00109a1d;
        }
        mbuffer[uVar11 + 0x3f8] = *(char *)((long)dict_key + local_50 + 0x5ff8);
        uVar9 = uVar11 + 1;
        lVar6 = local_50 - 4;
        local_50 = (ulong)dict_key[lVar6];
      } while (0xff < dict_key[lVar6]);
      if (0xfd < uVar11) {
        this_00 = (decoder_error *)__cxa_allocate_exception(0x10);
        decoder_error::decoder_error(this_00,"Overflow");
LAB_00109a1d:
        __cxa_throw(this_00,&decoder_error::typeinfo,decoder_error::~decoder_error);
      }
    }
    mbuffer[uVar9 + 0x3f8] = (char)local_50;
    do {
      lVar6 = lVar8 + 1;
      (*oexe->_vptr_output_exe_file[4])(oexe,lVar8,(ulong)(byte)mbuffer[uVar9 + 0x3f8],1);
      bVar15 = uVar9 != 0;
      uVar9 = uVar9 - 1;
      lVar8 = lVar6;
    } while (bVar15);
    uVar9 = (ulong)uVar5;
    dict_key[uVar9 - 4] = (uint16_t)local_48;
    uVar5 = uVar5 + 1;
    bVar15 = uVar7 < 0xc && (ushort)local_34 <= uVar5;
    local_34 = local_34 << bVar15;
    *(char *)((long)dict_key + uVar9 + 0x5ff8) = (char)local_50;
    uVar9 = bVar15 + uVar7;
    local_48 = (ulong)uVar10;
  } while( true );
}

Assistant:

void knowledge_dynamics::unpack(output_exe_file& oexe)
  {
    m_file.seek(m_code_offs);

    static const std::size_t MBUFFER_SIZE = 1024;
    static const std::size_t MBUFFER_EDGE = (MBUFFER_SIZE - 3);

    char mbuffer[MBUFFER_SIZE];
    m_file.read_buff(mbuffer, MBUFFER_SIZE);

    std::size_t pos = 0;
    bool reset_hack = false;
    std::size_t step = 9;
    std::size_t bx = 0;
    /*
     * The dictionary.
     * Each entry consists of an index to a previous entry
     * and a value, forming a tree.
     */
    uint16_t dict_key[768 * 16];
    uint8_t  dict_val[768 * 16];
    uint16_t dict_index = 0x0102; /* Start populating dictionary from 0x0102 */
    uint16_t dict_range = 0x0200; /* Allow that much entries before increasing step */

    /* Since data stored this way is backwards, we need a small queue */
    uint8_t queue[0xFF];
    std::size_t queued = 0;
    uint16_t next_index = 0;	/* block of data we currently examine */

    uint8_t last_char = 0;	/* value from previous iteration */
    uint16_t last_index = 0;	/* block from previous iteration */

    uint32_t big_index;	/* temp. variable to safely load and shift 3 bytes */
    uint16_t keep_index;	/* temp. variable to keep "next_index" before making it "last_index" */
    while (true)
      {
	if (reset_hack)
	  {
	    step = 9;
	    dict_range = 0x0200;
	    dict_index = 0x0102;
	  }
	std::size_t byte_pos = pos / 8;
	std::size_t bit_pos = pos % 8;

	pos += step;	/* And advance to the next chunk */

	if (byte_pos >= MBUFFER_EDGE)
	  {
	    std::size_t bytes_extra = MBUFFER_SIZE - byte_pos;//~= 3
	    std::size_t bytes_left = MBUFFER_SIZE - bytes_extra;//~= 1021

	    /* Copy leftovers */
	    for (std::size_t j = 0; j < bytes_extra; j++) mbuffer[j] = mbuffer[bytes_left + j];

	    /* Read in the rest */
	    std::size_t remains = static_cast <std::size_t> (m_file.bytes_remains());
	    if (remains < bytes_left)
	      {
		m_file.read_buff(mbuffer + bytes_extra, remains);
	      }
	    else
	      {
		m_file.read_buff(mbuffer + bytes_extra, bytes_left);
	      }
				

	    /* Reset cursor */
	    pos = bit_pos + step;	/* Add all unused bits */
	    byte_pos = 0;
	    /* On dictionary reset, use byte offset as bit offset*/
	    if (reset_hack)
	      {
		bit_pos = bytes_extra;
	      }
	  }
	
	big_index =
	  static_cast <uint32_t>((static_cast <uint8_t>(mbuffer[byte_pos + 2]) & 0x00FF) << 16) |
	  static_cast <uint32_t>((static_cast <uint8_t>(mbuffer[byte_pos + 1]) & 0x00FF) << 8) |
	  static_cast <uint32_t>(static_cast <uint8_t>(mbuffer[byte_pos]) & 0x00FF);

	big_index >>= bit_pos;

	next_index = static_cast <uint16_t> (big_index & 0xFFFF);

	static /* Those masks help us get the relevant bits */ 
	  const uint16_t keyMask[4] = {
	  0x01FF, 	// 0001 1111 
	  0x03FF,		// 0011 1111
	  0x07FF,		// 0111 1111
	  0x0FFF,		// 1111 1111
	};

	if (step - 9 >= sizeof (keyMask))
	  {
	    throw decoder_error ("Overflow");
	  }
	next_index &= keyMask[(step - 9)];
	/* Apply the value as-is, continuing with dictionary reset, C) */
	if (reset_hack)
	  {
	    /* Save index */
	    last_index = next_index;
	    /* Output char value */
	    last_char = static_cast <uint8_t>(next_index & 0x00FF);
	    oexe.code_fill(bx++, last_char, 1);
				
	    /* We're done with the hack */
	    reset_hack = false;
	    continue;
	  }
	if (next_index == 0x0101)	/* End Of File */
	  {
	    /* DONE */
	    break;
	  }

	if (next_index == 0x0100) 	/* Reset dictionary */
	  {
	    /* Postpone it into next iteration */
	    reset_hack = true;
	    continue;
	  }

	/* Remember *real* "next_index" */
	keep_index = next_index;

	/* No dictionary entry to query, step back */
	if (next_index >= dict_index)
	  {
	    next_index = last_index;
	    if (queued >= sizeof (queue))
	      {
		throw decoder_error ("Overflow");
	      }
	    /* Queue 1 char */
	    queue[queued++] = last_char;
	  }

	/* Quering dictionary? */
	while (next_index > 0x00ff)
	  {
			  
	    /* Queue 1 char */
	    if (queued >= sizeof (queue))
	      {
		throw decoder_error ("Overflow");
	      }
	    if (next_index >= sizeof (dict_val))
	      {
		throw decoder_error ("Overflow");
	      }
	    queue[queued++] = dict_val[next_index];
	    /* Next query: */
	    next_index = dict_key[next_index];
	  }

	/* Queue 1 char */
	last_char = static_cast <uint8_t> (next_index & 0x00FF);
	if (queued >= sizeof (queue))
	  {
	    throw decoder_error ("Overflow");
	  }
	queue[queued++] = last_char;

	/* Unqueue */
	while (queued)
	  {
	    oexe.code_fill(bx++, queue[--queued], 1);
	  }

	/* Save value to the dictionary */
	if (next_index >= sizeof (dict_val))
	  {
	    throw decoder_error ("Overflow");
	  }
	dict_key[dict_index] = last_index; /* "goto prev entry" */
	dict_val[dict_index] = last_char;  /* the value */
	dict_index++;

	/* Save *real* "next_index" */
	last_index = keep_index;

	/* Edge of dictionary, increase the bit-step, making range twice as large. */
	if (dict_index >= dict_range && step < 12)
	  {
	    step += 1;
	    dict_range = static_cast <uint16_t> (dict_range*2);
	  }
      }
    oexe[exe_file::INITIAL_CS] = m_header[exe_file::INITIAL_CS];
    oexe[exe_file::INITIAL_IP] = m_header[exe_file::INITIAL_IP];
    oexe[exe_file::INITIAL_SS] = m_header[exe_file::INITIAL_SS];
    oexe[exe_file::INITIAL_SP] = m_header[exe_file::INITIAL_SP];
    oexe[exe_file::MAX_MEM_PARA] = m_header[exe_file::MAX_MEM_PARA];
    oexe[exe_file::MIN_MEM_PARA] = static_cast <uint16_t> ((m_expected_size + 0x20) / 64);
    oexe.eval_structures();
  }